

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UBool currency_cleanup(void)

{
  EVP_PKEY_CTX *in_RDI;
  
  CReg::cleanup(in_RDI);
  currency_cache_cleanup();
  isoCodes_cleanup();
  currSymbolsEquiv_cleanup();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV currency_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    CReg::cleanup();
#endif
    /*
     * There might be some cached currency data or isoCodes data.
     */
    currency_cache_cleanup();
    isoCodes_cleanup();
    currSymbolsEquiv_cleanup();

    return TRUE;
}